

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_shrink(BUFFER_HANDLE handle,size_t decreaseSize,_Bool fromEnd)

{
  LOGGER_LOG p_Var1;
  size_t __size;
  uchar *__dest;
  LOGGER_LOG l_3;
  uchar *tmp;
  size_t alloc_size;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  _Bool fromEnd_local;
  size_t decreaseSize_local;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_shrink",0x184,1,"Failure: handle is invalid.");
    }
    l._0_4_ = 0x185;
  }
  else if (decreaseSize == 0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_shrink",0x18a,1,"Failure: decrease size is 0.");
    }
    l._0_4_ = 0x18b;
  }
  else if (handle->size < decreaseSize) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_shrink",400,1,"Failure: decrease size is less than buffer size.");
    }
    l._0_4_ = 0x191;
  }
  else {
    __size = handle->size - decreaseSize;
    if (__size == 0) {
      free(handle->buffer);
      handle->buffer = (uchar *)0x0;
      handle->size = 0;
      l._0_4_ = 0;
    }
    else {
      __dest = (uchar *)malloc(__size);
      if (__dest == (uchar *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/buffer.c"
                    ,"BUFFER_shrink",0x1a5,1,"Failure: allocating temp buffer.");
        }
        l._0_4_ = 0x1a6;
      }
      else {
        if (fromEnd) {
          memcpy(__dest,handle->buffer,__size);
          free(handle->buffer);
          handle->buffer = __dest;
          handle->size = __size;
        }
        else {
          memcpy(__dest,handle->buffer + decreaseSize,__size);
          free(handle->buffer);
          handle->buffer = __dest;
          handle->size = __size;
        }
        l._0_4_ = 0;
      }
    }
  }
  return (int)l;
}

Assistant:

int BUFFER_shrink(BUFFER_HANDLE handle, size_t decreaseSize, bool fromEnd)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_036: [ if handle is NULL, BUFFER_shrink shall return a non-null value ]*/
        LogError("Failure: handle is invalid.");
        result = MU_FAILURE;
    }
    else if (decreaseSize == 0)
    {
        /* Codes_SRS_BUFFER_07_037: [ If decreaseSize is equal zero, BUFFER_shrink shall return a non-null value ] */
        LogError("Failure: decrease size is 0.");
        result = MU_FAILURE;
    }
    else if (decreaseSize > handle->size)
    {
        /* Codes_SRS_BUFFER_07_038: [ If decreaseSize is less than the size of the buffer, BUFFER_shrink shall return a non-null value ] */
        LogError("Failure: decrease size is less than buffer size.");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_BUFFER_07_039: [ BUFFER_shrink shall allocate a temporary buffer of existing buffer size minus decreaseSize. ] */
        size_t alloc_size = handle->size - decreaseSize;
        if (alloc_size == 0)
        {
            /* Codes_SRS_BUFFER_07_043: [ If the decreaseSize is equal the buffer size , BUFFER_shrink shall deallocate the buffer and set the size to zero. ] */
            free(handle->buffer);
            handle->buffer = NULL;
            handle->size = 0;
            result = 0;
        }
        else
        {
            unsigned char* tmp = malloc(alloc_size);
            if (tmp == NULL)
            {
                /* Codes_SRS_BUFFER_07_042: [ If a failure is encountered, BUFFER_shrink shall return a non-null value ] */
                LogError("Failure: allocating temp buffer.");
                result = MU_FAILURE;
            }
            else
            {
                if (fromEnd)
                {
                    /* Codes_SRS_BUFFER_07_040: [ if the fromEnd variable is true, BUFFER_shrink shall remove the end of the buffer of size decreaseSize. ] */
                    memcpy(tmp, handle->buffer, alloc_size);
                    free(handle->buffer);
                    handle->buffer = tmp;
                    handle->size = alloc_size;
                    result = 0;
                }
                else
                {
                    /* Codes_SRS_BUFFER_07_041: [ if the fromEnd variable is false, BUFFER_shrink shall remove the beginning of the buffer of size decreaseSize. ] */
                    memcpy(tmp, handle->buffer + decreaseSize, alloc_size);
                    free(handle->buffer);
                    handle->buffer = tmp;
                    handle->size = alloc_size;
                    result = 0;
                }
            }
        }
    }
    return result;
}